

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hsluv.c
# Opt level: O3

void test_hsluv2rgb(void)

{
  double dVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double b;
  double g;
  double r;
  double local_48;
  double local_40;
  double local_38;
  
  lVar3 = 0;
  do {
    acutest_case_("%s",snapshot[0].hex_str + lVar3);
    dVar1 = *(double *)(snapshot[0].hex_str + lVar3 + 8);
    hsluv2rgb(*(double *)(snapshot[0].hex_str + lVar3 + 0x68),
              *(double *)(snapshot[0].hex_str + lVar3 + 0x70),
              *(double *)(snapshot[0].hex_str + lVar3 + 0x78),&local_38,&local_40,&local_48);
    dVar5 = local_38 - dVar1;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    iVar2 = acutest_check_((uint)((double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4) < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x22,"%s channel","red");
    if (iVar2 == 0) {
      acutest_message_("Produced: %f",local_38);
      acutest_message_("Expected: %f",dVar1);
    }
    dVar1 = *(double *)(snapshot[0].hex_str + lVar3 + 0x10);
    dVar5 = local_40 - dVar1;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    iVar2 = acutest_check_((uint)((double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4) < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x23,"%s channel","green");
    if (iVar2 == 0) {
      acutest_message_("Produced: %f",local_40);
      acutest_message_("Expected: %f",dVar1);
    }
    dVar1 = *(double *)(snapshot[0].hex_str + lVar3 + 0x18);
    dVar5 = local_48 - dVar1;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    iVar2 = acutest_check_((uint)((double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4) < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x24,"%s channel","blue");
    if (iVar2 == 0) {
      acutest_message_("Produced: %f",local_48);
      acutest_message_("Expected: %f",dVar1);
    }
    lVar3 = lVar3 + 0x98;
  } while (lVar3 != 0x98000);
  return;
}

Assistant:

static void
test_hsluv2rgb(void)
{
    int i;

    for(i = 0; i < snapshot_n; i++) {
        double r, g, b;

        TEST_CASE(snapshot[i].hex_str);

        hsluv2rgb(snapshot[i].hsluv_h, snapshot[i].hsluv_s, snapshot[i].hsluv_l, &r, &g, &b);

        TEST_CHANNEL("red", r, snapshot[i].rgb_r);
        TEST_CHANNEL("green", g, snapshot[i].rgb_g);
        TEST_CHANNEL("blue", b, snapshot[i].rgb_b);
    }
}